

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double layer,
          double xi,double eta,double layer_zeta)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChKblockGeneric *pCVar29;
  double *pdVar30;
  Index row;
  long lVar31;
  ActualDstType actualDst;
  ChElementShellANCF_3443 *this_00;
  pointer pLVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  double dVar47;
  undefined1 auVar48 [16];
  double dVar50;
  undefined1 auVar49 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_6c0 [16];
  double local_6b0;
  double dStack_6a8;
  undefined1 local_6a0 [32];
  Matrix<double,_3,_3,_0,_3,_3> local_680;
  undefined1 local_620 [16];
  Scalar local_608;
  Matrix<double,_3,_3,_0,_3,_3> local_600;
  undefined1 local_580 [392];
  double dStack_3f8;
  double dStack_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double local_3c0;
  undefined1 local_380 [16];
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  MatrixNx3c *local_330;
  Matrix<double,_3,_3,_1,_3,_3> *local_328;
  double local_320;
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar45._8_56_ = in_register_00001208;
  auVar45._0_8_ = layer;
  lVar31 = vcvttsd2usi_avx512f(auVar45._0_16_);
  dVar47 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar31].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_200,xi,eta,layer_zeta,dVar47,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar31] - this->m_thicknessZ * 0.5) +
             dVar47 * 0.5 + this->m_midsurfoffset);
  local_380._0_8_ = 1.0;
  local_3c0 = 0.0;
  local_580._384_8_ = 0.0;
  dStack_3f8 = 0.0;
  dStack_3f0 = 0.0;
  dStack_3e8 = 0.0;
  dStack_3e0 = 0.0;
  dStack_3d8 = 0.0;
  dStack_3d0 = 0.0;
  dStack_3c8 = 0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)(local_580 + 0x180),&this->m_ebar0,
             (MatrixNx3c *)local_200,(Scalar *)local_380);
  local_580._0_8_ = (MatrixNx3c *)local_200;
  local_580._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_580 + 0x180);
  local_380._0_8_ = (MatrixNx3c *)local_200;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8),(SrcXprType *)(local_580 + 8),
        (assign_op<double,_double> *)&local_680);
  local_330 = (MatrixNx3c *)local_380._0_8_;
  local_320 = 1.48219693752374e-323;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_380._8_8_;
  auVar36 = vbroadcastsd_avx512f(auVar33);
  auVar45 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array;
  auVar46 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
              m_storage).m_data.array + 8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_360;
  auVar37 = vbroadcastsd_avx512f(auVar7);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_370;
  auVar38 = vbroadcastsd_avx512f(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_348;
  auVar39 = vbroadcastsd_avx512f(auVar35);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_358;
  auVar40 = vbroadcastsd_avx512f(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_350;
  auVar41 = vbroadcastsd_avx512f(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_340;
  auVar42 = vbroadcastsd_avx512f(auVar10);
  auVar43 = vmulpd_avx512f(auVar45,auVar36);
  auVar36 = vmulpd_avx512f(auVar36,auVar46);
  auVar44 = vmulpd_avx512f(auVar45,auVar38);
  auVar43 = vfmadd231pd_avx512f(auVar43,auVar3,auVar37);
  auVar36 = vfmadd231pd_avx512f(auVar36,auVar4,auVar37);
  auVar37 = vfmadd231pd_avx512f(auVar44,auVar3,auVar40);
  local_200 = vfmadd231pd_avx512f(auVar43,auVar5,auVar39);
  local_1c0 = vfmadd231pd_avx512f(auVar36,auVar6,auVar39);
  auVar36 = vmulpd_avx512f(auVar46,auVar38);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_338;
  auVar38 = vbroadcastsd_avx512f(auVar11);
  local_180 = vfmadd231pd_avx512f(auVar37,auVar5,auVar42);
  auVar36 = vfmadd231pd_avx512f(auVar36,auVar4,auVar40);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_368;
  auVar37 = vbroadcastsd_avx512f(auVar12);
  local_140 = vfmadd231pd_avx512f(auVar36,auVar6,auVar42);
  auVar45 = vmulpd_avx512f(auVar45,auVar37);
  auVar46 = vmulpd_avx512f(auVar46,auVar37);
  auVar45 = vfmadd231pd_avx512f(auVar45,auVar41,auVar3);
  auVar46 = vfmadd231pd_avx512f(auVar46,auVar4,auVar41);
  local_100 = vfmadd231pd_avx512f(auVar45,auVar38,auVar5);
  local_c0 = vfmadd231pd_avx512f(auVar46,auVar6,auVar38);
  local_328 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_380);
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_580._0_8_ = (_func_int **)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_680,(Matrix3xN *)local_380,(MatrixNx3c *)local_200,(Scalar *)local_580);
  auVar24._8_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar24._0_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar33 = vunpcklpd_avx(auVar24,auVar55);
  auVar51._0_8_ =
       auVar33._0_8_ * auVar33._0_8_ +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
  auVar51._8_8_ =
       auVar33._8_8_ * auVar33._8_8_ +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar16._8_8_ = 0xbff0000000000000;
  auVar16._0_8_ = 0xbff0000000000000;
  auVar33 = vaddpd_avx512vl(auVar51,auVar16);
  auVar17._8_8_ = 0x3fe0000000000000;
  auVar17._0_8_ = 0x3fe0000000000000;
  local_6a0._0_16_ = vmulpd_avx512vl(auVar33,auVar17);
  dVar47 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  auVar33 = vunpcklpd_avx(auVar57,auVar55);
  auVar18._8_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar18._0_8_ =
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar33 = vmulpd_avx512vl(auVar33,auVar18);
  auVar56._0_8_ =
       auVar33._0_8_ +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar56._8_8_ =
       auVar33._8_8_ +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar47;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_620 = auVar59;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_580);
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_608 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_600,(Matrix3xN *)local_580,(Matrix<double,_16,_3,_0,_16,_3> *)local_200,
               &local_608);
    auVar26._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar26._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar33 = vunpcklpd_avx(auVar26,auVar61);
    auVar25._8_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar25._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar7 = vunpcklpd_avx(auVar25,auVar60);
    auVar53._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] + auVar7._0_8_ * auVar33._0_8_;
    auVar53._8_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar7._8_8_ * auVar33._8_8_;
    auVar58._8_8_ = this->m_Alpha;
    auVar58._0_8_ = this->m_Alpha;
    local_6a0._0_16_ = vfmadd231pd_fma(local_6a0._0_16_,auVar58,auVar53);
    auVar33 = vunpcklpd_avx(auVar64,auVar61);
    auVar19._8_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar19._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar34 = vmulpd_avx512vl(auVar33,auVar19);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_620._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar7 = vfmadd213sd_fma(auVar62,auVar58,auVar13);
    auVar33 = vunpcklpd_avx(auVar63,auVar60);
    auVar20._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar20._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar35 = vmulpd_avx512vl(auVar33,auVar20);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar47;
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar33 = vfmadd213sd_fma(auVar65,auVar58,auVar14);
    auVar48._0_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar35._0_8_ +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar34._0_8_;
    auVar48._8_8_ =
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar35._8_8_ +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar34._8_8_;
    auVar56 = vfmadd231pd_fma(auVar56,auVar58,auVar48);
    local_6c0 = vunpcklpd_avx(auVar7,auVar33);
  }
  else {
    local_6c0 = vunpcklpd_avx(auVar59,auVar52);
  }
  pLVar32 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)pLVar32[lVar31].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_00 = (ChElementShellANCF_3443 *)
            pLVar32[lVar31].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (ChElementShellANCF_3443 *)0x0) {
    this_00 = (ChElementShellANCF_3443 *)local_580;
    memcpy(this_00,(void *)(lVar15 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar29 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar29->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar29->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar29 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar29->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar29->super_ChKblock)._vptr_ChKblock + 1;
    }
    memcpy(local_580,(void *)(lVar15 + 0x20),0x120);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    pLVar32 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_580,pLVar32[lVar31].m_theta);
  local_6b0 = auVar56._0_8_;
  dStack_6a8 = auVar56._8_8_;
  pdVar30 = (double *)(local_580 + 0x20);
  lVar31 = 0;
  do {
    pdVar1 = pdVar30 + -2;
    pdVar21 = pdVar30 + -1;
    dVar47 = *pdVar30;
    pdVar22 = pdVar30 + 1;
    pdVar2 = pdVar30 + -4;
    pdVar23 = pdVar30 + -3;
    pdVar30 = pdVar30 + 6;
    dVar47 = (double)local_6a0._0_8_ * *pdVar2 +
             (double)local_6c0._0_8_ * *pdVar1 + local_6b0 * dVar47;
    dVar50 = (double)local_6a0._8_8_ * *pdVar23 +
             (double)local_6c0._8_8_ * *pdVar21 + dStack_6a8 * *pdVar22;
    auVar49._0_8_ = dVar47 + dVar50;
    auVar49._8_8_ = dVar47 + dVar50;
    dVar47 = (double)vmovlpd_avx(auVar49);
    local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar31] = dVar47;
    lVar31 = lVar31 + 1;
  } while (lVar31 != 6);
  auVar28._8_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar28._0_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar54._8_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar54._0_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar54._16_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar54._24_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar27._8_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar27._0_8_ =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar33 = vunpcklpd_avx(auVar27,auVar28);
  auVar54 = vblendpd_avx(ZEXT1632(auVar33),auVar54,8);
  auVar54 = vpermpd_avx2(auVar54,0xc4);
  *(undefined1 (*) [32])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar54;
  auVar33 = vshufpd_avx(auVar28,auVar28,1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar33;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_600.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3443::GetPK2Stress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}